

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::DoPreConfigureChecks(cmake *this)

{
  cmState *pcVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  allocator<char> local_299;
  undefined1 local_298 [8];
  string message;
  string currentStart;
  string local_250;
  undefined1 local_230 [8];
  string cacheStart;
  string local_208;
  int local_1e4;
  string local_1e0;
  undefined1 local_1c0 [8];
  ostringstream err;
  undefined1 local_38 [8];
  string srcList;
  cmake *this_local;
  
  srcList.field_2._8_8_ = this;
  psVar3 = GetHomeDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)local_38,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_38,"/CMakeLists.txt");
  bVar2 = cmsys::SystemTools::FileExists((string *)local_38);
  if (bVar2) {
    pcVar1 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"CMAKE_HOME_DIRECTORY",
               (allocator<char> *)(cacheStart.field_2._M_local_buf + 0xf));
    psVar3 = cmState::GetInitializedCacheValue(pcVar1,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)(cacheStart.field_2._M_local_buf + 0xf));
    if (psVar3 == (string *)0x0) {
      this_local._4_4_ = 0;
      local_1e4 = 1;
    }
    else {
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"CMAKE_HOME_DIRECTORY",
                 (allocator<char> *)(currentStart.field_2._M_local_buf + 0xf));
      psVar3 = cmState::GetInitializedCacheValue(pcVar1,&local_250);
      std::__cxx11::string::string((string *)local_230,(string *)psVar3);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)(currentStart.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::operator+=((string *)local_230,"/CMakeLists.txt");
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      std::__cxx11::string::string((string *)(message.field_2._M_local_buf + 8),(string *)psVar3);
      std::__cxx11::string::operator+=
                ((string *)(message.field_2._M_local_buf + 8),"/CMakeLists.txt");
      bVar2 = cmsys::SystemTools::SameFile
                        ((string *)local_230,(string *)((long)&message.field_2 + 8));
      if (bVar2) {
        local_1e4 = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_298,"The source \"",&local_299);
        std::allocator<char>::~allocator(&local_299);
        std::__cxx11::string::operator+=
                  ((string *)local_298,(string *)(message.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_298,"\" does not match the source \"");
        std::__cxx11::string::operator+=((string *)local_298,(string *)local_230);
        std::__cxx11::string::operator+=((string *)local_298,"\" used to generate cache.  ");
        std::__cxx11::string::operator+=
                  ((string *)local_298,"Re-run cmake with a different source directory.");
        cmSystemTools::Error((string *)local_298);
        this_local._4_4_ = -2;
        local_1e4 = 1;
        std::__cxx11::string::~string((string *)local_298);
      }
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_230);
      if (local_1e4 == 0) {
        this_local._4_4_ = 1;
        local_1e4 = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    bVar2 = cmsys::SystemTools::FileIsDirectory(psVar3);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)local_1c0,"The source directory \"");
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      std::operator<<(poVar4,"\" does not appear to contain CMakeLists.txt.\n");
    }
    else {
      psVar3 = GetHomeDirectory_abi_cxx11_(this);
      bVar2 = cmsys::SystemTools::FileExists(psVar3);
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)local_1c0,"The source directory \"");
        psVar3 = GetHomeDirectory_abi_cxx11_(this);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        std::operator<<(poVar4,"\" is a file, not a directory.\n");
      }
      else {
        poVar4 = std::operator<<((ostream *)local_1c0,"The source directory \"");
        psVar3 = GetHomeDirectory_abi_cxx11_(this);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        std::operator<<(poVar4,"\" does not exist.\n");
      }
    }
    std::operator<<((ostream *)local_1c0,
                    "Specify --help for usage, or press the help button on the CMake GUI.");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    this_local._4_4_ = -2;
    local_1e4 = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  }
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmake::DoPreConfigureChecks()
{
  // Make sure the Source directory contains a CMakeLists.txt file.
  std::string srcList = this->GetHomeDirectory();
  srcList += "/CMakeLists.txt";
  if (!cmSystemTools::FileExists(srcList)) {
    std::ostringstream err;
    if (cmSystemTools::FileIsDirectory(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not appear to contain CMakeLists.txt.\n";
    } else if (cmSystemTools::FileExists(this->GetHomeDirectory())) {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" is a file, not a directory.\n";
    } else {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not exist.\n";
    }
    err << "Specify --help for usage, or press the help button on the CMake "
           "GUI.";
    cmSystemTools::Error(err.str());
    return -2;
  }

  // do a sanity check on some values
  if (this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY")) {
    std::string cacheStart =
      *this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    cacheStart += "/CMakeLists.txt";
    std::string currentStart = this->GetHomeDirectory();
    currentStart += "/CMakeLists.txt";
    if (!cmSystemTools::SameFile(cacheStart, currentStart)) {
      std::string message = "The source \"";
      message += currentStart;
      message += "\" does not match the source \"";
      message += cacheStart;
      message += "\" used to generate cache.  ";
      message += "Re-run cmake with a different source directory.";
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    return 0;
  }
  return 1;
}